

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::ClearTest::ClearColor<float>
          (ClearTest *this,GLenum buffer,GLint drawbuffer,GLfloat value)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  bool bVar4;
  Enum<int,_2UL> EVar5;
  Enum<int,_2UL> local_1f0 [2];
  MessageBuilder local_1d0;
  int local_4c;
  GLfloat local_48;
  GLenum error;
  GLfloat value_vector [4];
  Functions *gl;
  GLfloat value_local;
  GLint drawbuffer_local;
  GLenum buffer_local;
  ClearTest *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  error = 0;
  value_vector[0] = 0.0;
  value_vector[1] = 0.0;
  local_48 = value;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1f0))(this->m_fbo,buffer,drawbuffer,&local_48);
  local_4c = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  bVar4 = local_4c == 0;
  if (!bVar4) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1d0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1d0,(char (*) [48])"ClearNamedFramebufferfv unexpectedly generated ")
    ;
    EVar5 = glu::getErrorStr(local_4c);
    local_1f0[0].m_getName = EVar5.m_getName;
    local_1f0[0].m_value = EVar5.m_value;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1f0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [20])" error. Test fails.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d0);
  }
  return bVar4;
}

Assistant:

bool ClearTest::ClearColor<glw::GLfloat>(glw::GLenum buffer, glw::GLint drawbuffer, glw::GLfloat value)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLfloat value_vector[4] = { value, 0, 0, 0 };

	gl.clearNamedFramebufferfv(m_fbo, buffer, drawbuffer, value_vector);

	if (glw::GLenum error = gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "ClearNamedFramebufferfv unexpectedly generated " << glu::getErrorStr(error)
			<< " error. Test fails." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}